

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O3

void __thiscall adiosStream::putADIOSArray(adiosStream *this,shared_ptr<VariableInfo> *ov)

{
  element_type *peVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare
                    ((char *)&((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->type);
  peVar1 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (iVar2 == 0) {
    adios2::Engine::Put<double>
              ((string *)&this->engine,(double *)peVar1,
               (Mode)(peVar1->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)&peVar1->type);
  peVar1 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&peVar1->type);
    if (iVar2 != 0) {
      return;
    }
    peVar1 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    adios2::Engine::Put<int>
              ((string *)&this->engine,(int *)peVar1,
               (Mode)(peVar1->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    return;
  }
  adios2::Engine::Put<float>
            ((string *)&this->engine,(float *)peVar1,
             (Mode)(peVar1->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  return;
}

Assistant:

void adiosStream::putADIOSArray(const std::shared_ptr<VariableInfo> ov)
{
    if (ov->type == "double")
    {
        const double *a = reinterpret_cast<const double *>(ov->data.data());
        engine.Put<double>(ov->name, a);
    }
    else if (ov->type == "float")
    {
        const float *a = reinterpret_cast<const float *>(ov->data.data());
        engine.Put<float>(ov->name, a);
    }
    else if (ov->type == "int")
    {
        const int *a = reinterpret_cast<const int *>(ov->data.data());
        engine.Put<int>(ov->name, a);
    }
}